

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O1

void __thiscall brown::Tile::drawcirc(Tile *this,int xc,int yc,int r,uint32_t col)

{
  uintptr_t uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int local_3c;
  int local_38;
  int local_34;
  
  local_34 = 1 - r;
  uVar1 = this->f;
  iVar10 = xc * 4;
  iVar6 = 0;
  local_3c = 3;
  uVar9 = xc;
  local_38 = iVar10;
  uVar5 = yc;
  while( true ) {
    uVar7 = r + yc;
    if (((uint)(xc + iVar6) < (uint)this->x) && (uVar7 < (uint)this->y)) {
      *(uint32_t *)(uVar1 + (long)(int)(this->p * uVar7 + local_38)) = col;
    }
    uVar4 = r + xc;
    uVar8 = yc + iVar6;
    if ((uVar4 < (uint)this->x) && (uVar8 < (uint)this->y)) {
      *(uint32_t *)(uVar1 + (long)(int)(this->p * uVar8 + uVar4 * 4)) = col;
    }
    if ((uVar4 < (uint)this->x) && (uVar5 < (uint)this->y)) {
      *(uint32_t *)(uVar1 + (long)(int)(this->p * uVar5 + uVar4 * 4)) = col;
    }
    uVar4 = yc - r;
    if (((uint)(xc + iVar6) < (uint)this->x) && (uVar4 < (uint)this->y)) {
      *(uint32_t *)(uVar1 + (long)(int)(this->p * uVar4 + local_38)) = col;
    }
    if ((uVar9 < (uint)this->x) && (uVar7 < (uint)this->y)) {
      *(uint32_t *)(uVar1 + (long)(int)(uVar7 * this->p + iVar10)) = col;
    }
    uVar7 = xc - r;
    if ((uVar7 < (uint)this->x) && (uVar8 < (uint)this->y)) {
      *(uint32_t *)(uVar1 + (long)(int)(uVar8 * this->p + uVar7 * 4)) = col;
    }
    if ((uVar7 < (uint)this->x) && (uVar5 < (uint)this->y)) {
      *(uint32_t *)(uVar1 + (long)(int)(this->p * uVar5 + uVar7 * 4)) = col;
    }
    if ((uVar9 < (uint)this->x) && (uVar4 < (uint)this->y)) {
      *(uint32_t *)(uVar1 + (long)(int)(uVar4 * this->p + iVar10)) = col;
    }
    iVar2 = iVar6 - r;
    if (r <= iVar6) break;
    iVar3 = local_3c;
    if (-1 < local_34) {
      r = r + -1;
      iVar3 = iVar2 * 2 + 5;
    }
    local_34 = local_34 + iVar3;
    iVar6 = iVar6 + 1;
    local_3c = local_3c + 2;
    iVar10 = iVar10 + -4;
    uVar9 = uVar9 - 1;
    uVar5 = uVar5 - 1;
    local_38 = local_38 + 4;
  }
  return;
}

Assistant:

void Tile::drawcirc (int xc, int yc, int r, std::uint32_t col)
{
    int x, y, d;
    for(x=0,y=r,d=1-r;1;x++)
    {
        this->drawpix(xc+x,yc+y,col); this->drawpix(xc+y,yc+x,col);
        this->drawpix(xc+y,yc-x,col); this->drawpix(xc+x,yc-y,col);
        this->drawpix(xc-x,yc+y,col); this->drawpix(xc-y,yc+x,col);
        this->drawpix(xc-y,yc-x,col); this->drawpix(xc-x,yc-y,col);
        if (x >= y) break;
        if (d < 0) { d += ( x   <<1)+3; } else
                      { d += ((x-y)<<1)+5; y--; }
    }
}